

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

v4sf * rfftb1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  int iVar1;
  int iVar2;
  int ido_00;
  int iVar3;
  bool bVar4;
  v4sf *local_88;
  int ix2_2;
  int ix3_1;
  int ix2_1;
  int ix4;
  int ix3;
  int ix2;
  int ido;
  int l2;
  int ip;
  int iw;
  int l1;
  int k1;
  int nf;
  v4sf *out;
  v4sf *in;
  int *ifac_local;
  float *wa_local;
  v4sf *work2_local;
  v4sf *work1_local;
  v4sf *input_readonly_local;
  int n_local;
  
  local_88 = work2;
  if (input_readonly == work2) {
    local_88 = work1;
  }
  _k1 = local_88;
  iVar1 = ifac[1];
  ip = 1;
  l2 = 0;
  if (input_readonly == local_88) {
    __assert_fail("in != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x3f6,
                  "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
  }
  out = input_readonly;
  for (iw = 1; iw <= iVar1; iw = iw + 1) {
    iVar2 = ifac[(long)iw + 1];
    ido_00 = n / (iVar2 * ip);
    switch(iVar2) {
    case 2:
      radb2_ps(ido_00,ip,out,_k1,wa + l2);
      break;
    case 3:
      radb3_ps(ido_00,ip,out,_k1,wa + l2,wa + (l2 + ido_00));
      break;
    case 4:
      radb4_ps(ido_00,ip,out,_k1,wa + l2,wa + (l2 + ido_00),wa + (l2 + ido_00 + ido_00));
      break;
    case 5:
      iVar3 = l2 + ido_00 + ido_00;
      radb5_ps(ido_00,ip,out,_k1,wa + l2,wa + (l2 + ido_00),wa + iVar3,wa + (iVar3 + ido_00));
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                    ,0x40f,
                    "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)"
                   );
    }
    l2 = (iVar2 + -1) * ido_00 + l2;
    bVar4 = _k1 == work2;
    _k1 = work2;
    out = work1;
    if (bVar4) {
      _k1 = work1;
      out = work2;
    }
    ip = iVar2 * ip;
  }
  return out;
}

Assistant:

static NEVER_INLINE(v4sf *) rfftb1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l1 = 1;
  int iw = 0;
  assert(in != out);
  for (k1=1; k1<=nf; k1++) {
    int ip = ifac[k1 + 1];
    int l2 = ip*l1;
    int ido = n / l2;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radb5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radb4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radb3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radb2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l1 = l2;
    iw += (ip - 1)*ido;

    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}